

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O2

VkBool32 demo_check_layers(uint32_t check_count,char **check_names,uint32_t layer_count,
                          VkLayerProperties *layers)

{
  int iVar1;
  VkLayerProperties *__s2;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 0;
  do {
    __s2 = layers;
    lVar3 = (ulong)layer_count + 1;
    if (uVar2 == check_count) {
      return 1;
    }
    do {
      if (lVar3 + -1 == 0) {
        fprintf(_stderr,"Cannot find layer: %s\n",check_names[uVar2 & 0xffffffff]);
        return 0;
      }
      iVar1 = strcmp(check_names[uVar2],__s2->layerName);
      __s2 = __s2 + 1;
      lVar3 = lVar3 + -1;
    } while (iVar1 != 0);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static VkBool32 demo_check_layers(uint32_t check_count, const char **check_names,
                                  uint32_t layer_count,
                                  VkLayerProperties *layers) {
    uint32_t i, j;
    for (i = 0; i < check_count; i++) {
        VkBool32 found = 0;
        for (j = 0; j < layer_count; j++) {
            if (!strcmp(check_names[i], layers[j].layerName)) {
                found = 1;
                break;
            }
        }
        if (!found) {
            fprintf(stderr, "Cannot find layer: %s\n", check_names[i]);
            return 0;
        }
    }
    return 1;
}